

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int io_popen(lua_State *L)

{
  int iVar1;
  char *fname;
  LStream *pLVar2;
  
  fname = luaL_checklstring(L,1,(size_t *)0x0);
  luaL_optlstring(L,2,"r",(size_t *)0x0);
  pLVar2 = newprefile(L);
  luaL_error(L,"\'popen\' not supported");
  pLVar2->f = (FILE *)0x0;
  pLVar2->closef = io_pclose;
  iVar1 = luaL_fileresult(L,0,fname);
  return iVar1;
}

Assistant:

static int io_popen(lua_State *L) {
    const char *filename = luaL_checkstring(L, 1);
    const char *mode = luaL_optstring(L, 2, "r");
    LStream *p = newprefile(L);
    p->f = l_popen(L, filename, mode);
    p->closef = &io_pclose;
    return (p->f == NULL) ? luaL_fileresult(L, 0, filename) : 1;
}